

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::dJ3
          (TPZTensor<TFad<6,_double>_> *this,TPZTensor<TFad<6,_double>_> *deriv)

{
  TPZTensor<TFad<6,_double>_> *pTVar1;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_478;
  TPZTensor<TFad<6,_double>_> *local_468;
  TPZTensor<TFad<6,_double>_> *local_460;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_458;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_448;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_438;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_428;
  undefined1 local_418 [24];
  R local_400;
  undefined1 local_3f8 [24];
  R local_3e0;
  undefined1 local_3d8 [24];
  TFad<6,_double> *local_3c0;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_3b8;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_3a8;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_398;
  undefined1 local_388 [24];
  R local_370;
  undefined1 local_368 [16];
  undefined1 local_358 [24];
  R local_340;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  local_338;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  local_328;
  undefined1 local_318 [16];
  TFad<6,_double> *local_308;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  local_300;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_2f0;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_2e0;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_2d0;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_2c0;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_2b0;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_2a0;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_290;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  local_280;
  TFad<6,_double> local_270;
  TFad<6,_double> local_230;
  TFad<6,_double> local_1f0;
  TFad<6,_double> local_1b0;
  TFad<6,_double> local_170;
  TFad<6,_double> local_130;
  TFad<6,_double> local_f0;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  local_468 = deriv;
  TFad<6,_double>::TFad(&local_130,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore);
  TFad<6,_double>::TFad(&local_170,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 1);
  local_460 = this;
  TFad<6,_double>::TFad(&local_1b0,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 1);
  TFad<6,_double>::TFad(&local_70,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 2);
  TFad<6,_double>::TFad(&local_1f0,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 2);
  TFad<6,_double>::TFad(&local_230,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 3);
  TFad<6,_double>::TFad(&local_b0,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 4);
  TFad<6,_double>::TFad(&local_f0,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 4);
  TFad<6,_double>::TFad(&local_270,(this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 5);
  pTVar1 = local_468;
  local_3f8._0_8_ = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_358._0_8_ = local_3f8;
  local_3f8._16_8_ = local_358;
  local_358._8_8_ = 2.0;
  local_3d8._0_8_ = local_3f8 + 0x10;
  local_3e0.constant_ = 9.0;
  local_368._0_8_ = local_3f8._0_8_ + 0x40;
  local_418._16_8_ = local_368;
  local_3d8._8_8_ = local_418 + 0x10;
  local_428.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3f8._0_8_ + 0x80);
  local_418._0_8_ = &local_428;
  local_438.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_3f8._0_8_ + 0xc0);
  local_388._0_8_ = local_318 + 8;
  local_398.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_438;
  local_458.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_3f8._0_8_ + 0x100);
  local_3a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_458;
  local_290.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2a0;
  local_2f0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3f8._0_8_ + 0x140);
  local_2c0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_2d0;
  local_2e0.fadexpr_.left_ = &local_2f0;
  local_400.constant_ = 3.0;
  local_3d8._16_8_ = local_3d8;
  local_3c0 = (TFad<6,_double> *)local_418;
  local_418._8_8_ = 3.0;
  local_3b8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3d8 + 0x10);
  local_388._16_8_ = local_388;
  local_388._8_8_ = 2.0;
  local_3b8.fadexpr_.right_.constant_ = (double)((long)local_388 + 0x10);
  local_370.constant_ = 9.0;
  local_358._16_8_ = &local_3b8;
  local_340.constant_ = (double)&local_398;
  local_398.fadexpr_.right_.constant_ = 9.0;
  local_448.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_3a8;
  local_3a8.fadexpr_.right_.constant_ = 2.0;
  local_338.fadexpr_.right_ = &local_448;
  local_448.fadexpr_.right_.constant_ = 3.0;
  local_328.fadexpr_.left_ = &local_338;
  local_280.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_290;
  local_290.fadexpr_.right_.constant_ = 2.0;
  local_328.fadexpr_.right_ = &local_280;
  local_280.fadexpr_.right_.constant_ = 9.0;
  local_2b0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2c0;
  local_2c0.fadexpr_.right_.constant_ = 4.0;
  local_300.fadexpr_.right_ = &local_2b0;
  local_2b0.fadexpr_.right_.constant_ = 9.0;
  local_478.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2e0;
  local_2e0.fadexpr_.right_.constant_ = 9.0;
  local_478.fadexpr_.left_ = &local_300;
  local_458.fadexpr_.right_.constant_ = (double)local_458.fadexpr_.left_;
  local_438.fadexpr_.right_.constant_ = (double)local_438.fadexpr_.left_;
  local_428.fadexpr_.right_.constant_ = (double)local_428.fadexpr_.left_;
  local_3f8._8_8_ = local_3f8._0_8_;
  local_368._8_8_ = local_368._0_8_;
  local_338.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
        *)(local_358 + 0x10);
  local_318._8_8_ = local_3f8._0_8_;
  local_308 = (TFad<6,_double> *)local_438.fadexpr_.left_;
  local_300.fadexpr_.left_ = &local_328;
  local_2f0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  local_2d0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)local_438.fadexpr_.left_;
  local_2d0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  local_2a0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)local_3f8._0_8_;
  local_2a0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  TFad<6,double>::operator=
            ((TFad<6,double> *)(local_468->fData).super_TPZVec<TFad<6,_double>_>.fStore,&local_478);
  local_3f8._16_8_ = &local_130;
  local_3d8._0_8_ = local_3f8 + 0x10;
  local_418._0_8_ = &local_170;
  local_3d8._16_8_ = local_3d8;
  local_3d8._8_8_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)0x4008000000000000;
  local_358._0_8_ = local_3f8;
  local_3f8._8_8_ = &local_230;
  local_3c0 = (TFad<6,_double> *)local_358;
  local_358._8_8_ = 3.0;
  local_3b8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3d8 + 0x10);
  local_368._0_8_ = local_418;
  local_448.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_270;
  local_418._16_8_ = local_368;
  local_368._8_8_ = 2.0;
  local_3b8.fadexpr_.right_.constant_ = (double)(local_418 + 0x10);
  local_400.constant_ = 3.0;
  local_358._16_8_ = &local_3b8;
  local_428.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)((long)local_388 + 0x10);
  local_448.fadexpr_.right_.constant_ = (double)&local_1b0;
  local_340.constant_ = (double)&local_428;
  local_428.fadexpr_.right_.constant_ = 3.0;
  local_388._0_8_ = local_318 + 8;
  local_338.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)local_388;
  local_388._8_8_ = 3.0;
  local_328.fadexpr_.left_ = &local_338;
  local_438.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_448;
  local_398.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_438;
  local_438.fadexpr_.right_.constant_ = 2.0;
  local_328.fadexpr_.right_ = &local_398;
  local_398.fadexpr_.right_.constant_ = 3.0;
  local_300.fadexpr_.right_ = &local_3a8;
  local_3a8.fadexpr_.right_.constant_ = (double)&local_1f0;
  local_478.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_458;
  local_478.fadexpr_.left_ = &local_300;
  local_458.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_70;
  local_458.fadexpr_.right_.constant_ = (double)&local_f0;
  local_418._8_8_ = local_448.fadexpr_.left_;
  local_3f8._0_8_ = local_418._0_8_;
  local_3e0.constant_ = (double)local_418._0_8_;
  local_3a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_b0;
  local_388._16_8_ = local_3f8._16_8_;
  local_370.constant_ = local_448.fadexpr_.right_.constant_;
  local_338.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
        *)(local_358 + 0x10);
  local_318._8_8_ = local_3f8._8_8_;
  local_308 = (TFad<6,_double> *)local_448.fadexpr_.right_.constant_;
  local_300.fadexpr_.left_ = &local_328;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((pTVar1->fData).super_TPZVec<TFad<6,_double>_>.fStore + 1),
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)&local_478);
  local_3d8._0_8_ = local_3f8 + 0x10;
  local_3f8._16_8_ = &local_130;
  local_3d8._16_8_ = local_3d8;
  local_3d8._8_8_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)0x4008000000000000;
  local_3f8._0_8_ = local_418 + 0x10;
  local_438.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_230;
  local_358._0_8_ = local_3f8;
  local_3f8._8_8_ = 2.0;
  local_3c0 = (TFad<6,_double> *)local_358;
  local_358._8_8_ = 3.0;
  local_3b8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3d8 + 0x10);
  local_3b8.fadexpr_.right_.constant_ = (double)local_368;
  local_368._0_8_ = &local_170;
  local_358._16_8_ = &local_3b8;
  local_418._0_8_ = &local_428;
  local_428.fadexpr_.right_.constant_ = (double)&local_270;
  local_340.constant_ = (double)local_418;
  local_418._8_8_ = 3.0;
  local_338.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
        *)(local_358 + 0x10);
  local_388._16_8_ = local_388;
  local_438.fadexpr_.right_.constant_ = (double)&local_1f0;
  local_338.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)((long)local_388 + 0x10);
  local_370.constant_ = 3.0;
  local_328.fadexpr_.left_ = &local_338;
  local_398.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_438;
  local_318._8_8_ = &local_398;
  local_398.fadexpr_.right_.constant_ = 2.0;
  local_308 = (TFad<6,_double> *)0x4008000000000000;
  local_300.fadexpr_.left_ = &local_328;
  local_448.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_3a8;
  local_300.fadexpr_.right_ = &local_448;
  local_448.fadexpr_.right_.constant_ = 3.0;
  local_478.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_458;
  local_458.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_1b0;
  local_478.fadexpr_.left_ = &local_300;
  local_458.fadexpr_.right_.constant_ = (double)&local_f0;
  local_428.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_70;
  local_418._16_8_ = &local_70;
  local_400.constant_ = (double)local_438.fadexpr_.left_;
  local_3e0.constant_ = (double)&local_70;
  local_3a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)local_428.fadexpr_.right_.constant_;
  local_3a8.fadexpr_.right_.constant_ = local_438.fadexpr_.right_.constant_;
  local_388._0_8_ = local_3f8._16_8_;
  local_388._8_8_ = local_438.fadexpr_.right_.constant_;
  local_368._8_8_ = &local_b0;
  local_328.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)(local_318 + 8);
  TFad<6,double>::operator=
            ((TFad<6,double> *)((pTVar1->fData).super_TPZVec<TFad<6,_double>_>.fStore + 2),
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)&local_478);
  local_358._0_8_ = (local_460->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_418._16_8_ = local_358._0_8_ + 0x40;
  local_3f8._0_8_ = local_418 + 0x10;
  local_428.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_358._0_8_ + 0x80);
  local_418._0_8_ = &local_428;
  local_458.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_358._0_8_ + 0x100);
  local_448.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_358._0_8_ + 0xc0);
  local_438.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_448;
  local_2c0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_2d0;
  local_290.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2a0;
  local_2f0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_358._0_8_ + 0x140);
  local_2e0.fadexpr_.left_ = &local_2f0;
  local_3f8._16_8_ = local_318;
  local_3d8._0_8_ = local_3f8 + 0x10;
  local_3e0.constant_ = 9.0;
  local_3d8._8_8_ = local_3f8;
  local_3f8._8_8_ = 3.0;
  local_3d8._16_8_ = local_3d8;
  local_368._0_8_ = local_418;
  local_418._8_8_ = 2.0;
  local_3c0 = (TFad<6,_double> *)local_368;
  local_368._8_8_ = 3.0;
  local_3b8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3d8 + 0x10);
  local_388._16_8_ = local_388;
  local_388._8_8_ = 2.0;
  local_370.constant_ = 9.0;
  local_358._16_8_ = &local_3b8;
  local_398.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_438;
  local_438.fadexpr_.right_.constant_ = 2.0;
  local_398.fadexpr_.right_.constant_ = 9.0;
  local_338.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
        *)(local_358 + 0x10);
  local_338.fadexpr_.right_ = &local_3a8;
  local_3a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_458;
  local_3a8.fadexpr_.right_.constant_ = 3.0;
  local_280.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_290;
  local_290.fadexpr_.right_.constant_ = 4.0;
  local_328.fadexpr_.right_ = &local_280;
  local_280.fadexpr_.right_.constant_ = 9.0;
  local_300.fadexpr_.left_ = &local_328;
  local_2b0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2c0;
  local_2c0.fadexpr_.right_.constant_ = 2.0;
  local_300.fadexpr_.right_ = &local_2b0;
  local_2b0.fadexpr_.right_.constant_ = 9.0;
  local_478.fadexpr_.left_ = &local_300;
  local_478.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2e0;
  local_2e0.fadexpr_.right_.constant_ = 9.0;
  local_458.fadexpr_.right_.constant_ = (double)local_458.fadexpr_.left_;
  local_448.fadexpr_.right_.constant_ = (double)local_448.fadexpr_.left_;
  local_428.fadexpr_.right_.constant_ = (double)local_428.fadexpr_.left_;
  local_400.constant_ = (double)local_418._16_8_;
  local_3b8.fadexpr_.right_.constant_ = (double)((long)local_388 + 0x10U);
  local_388._0_8_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)(local_318 + 8);
  local_358._8_8_ = local_358._0_8_;
  local_340.constant_ = (double)&local_398;
  local_328.fadexpr_.left_ = &local_338;
  local_318._0_8_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)local_358;
  local_318._8_8_ = local_358._0_8_;
  local_308 = (TFad<6,_double> *)local_448.fadexpr_.left_;
  local_2f0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  local_2d0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)local_448.fadexpr_.left_;
  local_2d0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  local_2a0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)local_358._0_8_;
  local_2a0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((local_468->fData).super_TPZVec<TFad<6,_double>_>.fStore + 3),
             (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
              *)&local_478);
  pTVar1 = local_468;
  local_3d8._0_8_ = local_3f8 + 0x10;
  local_3e0.constant_ = -2.0;
  local_398.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_130;
  local_418._0_8_ = &local_b0;
  local_3f8._0_8_ = local_418 + 0x10;
  local_448.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_230;
  local_368._0_8_ = local_418;
  local_340.constant_ = (double)&local_428;
  local_428.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_70;
  local_428.fadexpr_.right_.constant_ = (double)&local_1b0;
  local_388._16_8_ = &local_170;
  local_370.constant_ = (double)&local_1f0;
  local_438.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_448;
  local_458.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_270;
  local_3a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_458;
  local_458.fadexpr_.right_.constant_ = (double)&local_f0;
  local_3d8._16_8_ = local_3d8;
  local_3d8._8_8_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)0x4008000000000000;
  local_3c0 = (TFad<6,_double> *)local_3f8;
  local_3f8._8_8_ = 3.0;
  local_3b8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3d8 + 0x10);
  local_368._8_8_ = 3.0;
  local_358._16_8_ = &local_3b8;
  local_338.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
        *)(local_358 + 0x10);
  local_308 = (TFad<6,_double> *)0x4000000000000000;
  local_388._8_8_ = 3.0;
  local_300.fadexpr_.left_ = &local_328;
  local_300.fadexpr_.right_ = &local_438;
  local_438.fadexpr_.right_.constant_ = 3.0;
  local_478.fadexpr_.left_ = &local_300;
  local_3a8.fadexpr_.right_.constant_ = 3.0;
  local_478.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_3a8;
  local_448.fadexpr_.right_.constant_ = local_458.fadexpr_.right_.constant_;
  local_418._8_8_ = local_458.fadexpr_.left_;
  local_418._16_8_ = local_448.fadexpr_.left_;
  local_400.constant_ = (double)local_418._0_8_;
  local_3f8._16_8_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)local_358;
  local_3b8.fadexpr_.right_.constant_ = (double)local_368;
  local_398.fadexpr_.right_.constant_ = local_458.fadexpr_.right_.constant_;
  local_388._0_8_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_318 + 8);
  local_358._0_8_ = local_398.fadexpr_.left_;
  local_358._8_8_ = local_418._0_8_;
  local_338.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)((long)local_388 + 0x10U);
  local_328.fadexpr_.left_ = &local_338;
  local_328.fadexpr_.right_ =
       (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
        *)local_388;
  local_318._8_8_ = &local_398;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((local_468->fData).super_TPZVec<TFad<6,_double>_>.fStore + 4),
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
              *)&local_478);
  local_358._0_8_ = (local_460->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_318._0_8_ = local_358;
  local_3f8._16_8_ = local_318;
  local_3d8._0_8_ = local_3f8 + 0x10;
  local_368._0_8_ = local_358._0_8_ + 0x40;
  local_3f8._0_8_ = local_418 + 0x10;
  local_418._16_8_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)0x4000000000000000;
  local_3d8._8_8_ = local_3f8;
  local_3e0.constant_ = 9.0;
  local_3d8._16_8_ = local_3d8;
  local_3f8._8_8_ = 3.0;
  local_428.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_358._0_8_ + 0x80);
  local_418._0_8_ = &local_428;
  local_3c0 = (TFad<6,_double> *)local_418;
  local_3b8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_3d8 + 0x10);
  local_418._8_8_ = 3.0;
  local_438.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_358._0_8_ + 0xc0);
  local_388._8_8_ = 4.0;
  local_3b8.fadexpr_.right_.constant_ = (double)((long)local_388 + 0x10);
  local_358._16_8_ = &local_3b8;
  local_370.constant_ = 9.0;
  local_398.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_438;
  local_340.constant_ = (double)&local_398;
  local_338.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
        *)(local_358 + 0x10);
  local_398.fadexpr_.right_.constant_ = 9.0;
  local_3a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_358._0_8_ + 0x100);
  local_338.fadexpr_.right_ = &local_448;
  local_448.fadexpr_.right_.constant_ = 3.0;
  local_328.fadexpr_.left_ = &local_338;
  local_280.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_290;
  local_2f0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)(local_358._0_8_ + 0x140);
  local_458.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_280;
  local_280.fadexpr_.right_.constant_ = 2.0;
  local_328.fadexpr_.right_ = &local_458;
  local_300.fadexpr_.left_ = &local_328;
  local_458.fadexpr_.right_.constant_ = 9.0;
  local_2b0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2c0;
  local_2a0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_2b0;
  local_2b0.fadexpr_.right_.constant_ = 2.0;
  local_300.fadexpr_.right_ = &local_2a0;
  local_478.fadexpr_.left_ = &local_300;
  local_2a0.fadexpr_.right_.constant_ = 9.0;
  local_2e0.fadexpr_.left_ = &local_2f0;
  local_2d0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_2e0;
  local_2e0.fadexpr_.right_.constant_ = 2.0;
  local_478.fadexpr_.right_ = &local_2d0;
  local_2d0.fadexpr_.right_.constant_ = 9.0;
  local_448.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)&local_3a8;
  local_438.fadexpr_.right_.constant_ = (double)local_438.fadexpr_.left_;
  local_428.fadexpr_.right_.constant_ = (double)local_428.fadexpr_.left_;
  local_400.constant_ = (double)local_368;
  local_3a8.fadexpr_.right_.constant_ = (double)local_3a8.fadexpr_.left_;
  local_388._0_8_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)(local_318 + 8);
  local_388._16_8_ = (TFad<6,_double> *)local_388;
  local_368._8_8_ = local_368._0_8_;
  local_358._8_8_ = local_358._0_8_;
  local_318._8_8_ = local_358._0_8_;
  local_308 = (TFad<6,_double> *)local_438.fadexpr_.left_;
  local_2f0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  local_2c0.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)local_438.fadexpr_.left_;
  local_2c0.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  local_290.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
        *)local_358._0_8_;
  local_290.fadexpr_.right_.constant_ = (double)local_2f0.fadexpr_.left_;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((pTVar1->fData).super_TPZVec<TFad<6,_double>_>.fStore + 5),
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
              *)&local_478);
  return;
}

Assistant:

void TPZTensor<T>::dJ3(TPZTensor<T> &deriv) const {
    T state0(fData[_XX_]), state1(fData[_XY_]), statex1(fData[_XY_]),
            state2(fData[_XZ_]), statex2(fData[_XZ_]), state3(fData[_YY_]),
            state4(fData[_YZ_]), statex4(fData[_YZ_]), state5(fData[_ZZ_]);
    deriv.fData[_XX_] = (fData[_XX_] * fData[_XX_]*2.) / 9. + fData[_XY_] * fData[_XY_] / 3. +
            fData[_XZ_] * fData[_XZ_] / 3. - (fData[_XX_] * fData[_YY_]*2.) / 9. -
            fData[_YY_] * fData[_YY_] / 9. - (fData[_YZ_] * fData[_YZ_]*2.) / 3. - (fData[_XX_] * fData[_ZZ_]*2.) /
            9. + (fData[_YY_] * fData[_ZZ_]*4.) / 9. - fData[_ZZ_] * fData[_ZZ_] / 9.;
    deriv.fData[_XY_] = (state0 * state1) / 3. + (state1 * state3) / 3. -
            (state1 * state5 * 2.) / 3. + (state0 * statex1) / 3. +
            (state3 * statex1) / 3. - (state5 * statex1 * 2.) / 3. +
            state4 * statex2 + state2*statex4;
    deriv.fData[_XZ_] = (state0 * state2) / 3. - (state2 * state3 * 2.) / 3. +
            state1 * state4 + (state2 * state5) / 3. +
            (state0 * statex2) / 3. - (state3 * statex2 * 2.) / 3. +
            (state5 * statex2) / 3. + statex1*statex4;
    deriv.fData[_YY_] = -(fData[_XX_] * fData[_XX_]) / 9. +
            (fData[_XY_] * fData[_XY_]) / 3. - ((fData[_XZ_] * fData[_XZ_])*2.) / 3. - (fData[_XX_] * fData[_YY_]*2.) / 9. + ((fData[_YY_] * fData[_YY_])*2.) / 9. +
            (fData[_YZ_] * fData[_YZ_]) / 3. + (fData[_XX_] * fData[_ZZ_]*4.) / 9. - (fData[_YY_] * fData[_ZZ_]*2.) / 9. -
            (fData[_ZZ_] * fData[_ZZ_]) / 9.;
    deriv.fData[_YZ_] = (state0 * state4 * (-2.)) / 3. + (state3 * state4) / 3. +
            (state4 * state5) / 3. + state2 * statex1 +
            state1 * statex2 - (state0 * statex4 * 2.) / 3. +
            (state3 * statex4) / 3. + (state5 * statex4) / 3.;
    deriv.fData[_ZZ_] = -(fData[_XX_] * fData[_XX_]) / 9. - (2. * (fData[_XY_] * fData[_XY_])) / 3. +
            (fData[_XZ_] * fData[_XZ_]) / 3. + (fData[_XX_] * fData[_YY_]*4.) / 9. - (fData[_YY_] * fData[_YY_]) / 9. +
            (fData[_YZ_] * fData[_YZ_]) / 3. - (fData[_XX_] * fData[_ZZ_]*2.) / 9. - (fData[_YY_] * fData[_ZZ_]*2.) /
            9. + ((fData[_ZZ_] * fData[_ZZ_])*2.) / 9.;

}